

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow *window,ImGuiDir dir)

{
  ImGuiID IVar1;
  uint uVar2;
  long lVar3;
  int n;
  int local_c;
  
  local_c = dir + 4;
  lVar3 = 0;
  IVar1 = ImHashStr("#RESIZE",0,window->ID);
  uVar2 = ~IVar1;
  do {
    uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar3) ^ uVar2 & 0xff];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return ~uVar2;
}

Assistant:

ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow* window, ImGuiDir dir)
{
    IM_ASSERT(dir >= 0 && dir < 4);
    int n = (int)dir + 4;
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}